

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

bool google::protobuf::util::anon_unknown_0::CheckFieldTypeUrl
               (Type *type,string_view name,string_view type_url)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  Field *this;
  string *this_00;
  string_view name_00;
  Field *field;
  Type *type_local;
  string_view type_url_local;
  string_view name_local;
  
  name_00._M_str = (char *)type_url._M_len;
  name_00._M_len = name._M_str;
  this = FindField((anon_unknown_0 *)type,(Type *)name._M_len,name_00);
  if (this == (Field *)0x0) {
    name_local._M_str._7_1_ = false;
  }
  else {
    this_00 = Field::type_url_abi_cxx11_(this);
    __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    name_local._M_str._7_1_ = std::operator==(__x,type_url);
  }
  return name_local._M_str._7_1_;
}

Assistant:

bool CheckFieldTypeUrl(const Type& type, absl::string_view name,
                       absl::string_view type_url) {
  const Field* field = FindField(type, name);
  if (field == nullptr) {
    return false;
  }
  return field->type_url() == type_url;
}